

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O1

REF_STATUS
ref_split_edge_tri_quality
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  REF_INT RVar5;
  int iVar6;
  double dVar7;
  REF_DBL area1;
  REF_DBL area0;
  REF_DBL quality1;
  REF_DBL quality0;
  REF_DBL quality;
  REF_INT nodes [27];
  double local_f8;
  int local_f0;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  *allowed = 0;
  ref_cell = ref_grid->cell[3];
  uVar3 = 0xffffffff;
  if (-1 < node0) {
    uVar3 = 0xffffffff;
    if (node0 < ref_cell->ref_adj->nnode) {
      uVar3 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node0];
    }
  }
  if ((int)uVar3 == -1) {
    local_f8 = 1.0;
  }
  else {
    RVar5 = ref_cell->ref_adj->item[(int)uVar3].ref;
    local_f8 = 1.0;
    do {
      if (0 < ref_cell->node_per) {
        lVar4 = 0;
        do {
          if (ref_cell->c2n[(long)ref_cell->size_per * (long)RVar5 + lVar4] == node1) {
            uVar2 = ref_cell_nodes(ref_cell,RVar5,local_a8);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x354,"ref_split_edge_tri_quality",(ulong)uVar2,"cell nodes");
              return uVar2;
            }
            uVar2 = ref_node_tri_quality(ref_node,local_a8,&local_b0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x356,"ref_split_edge_tri_quality",(ulong)uVar2,"q");
              return uVar2;
            }
            if (local_b0 <= local_f8) {
              local_f8 = local_b0;
            }
          }
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 < ref_cell->node_per);
      }
      pRVar1 = ref_cell->ref_adj->item;
      local_f0 = (int)uVar3;
      iVar6 = pRVar1[local_f0].next;
      uVar3 = (ulong)iVar6;
      if (uVar3 == 0xffffffffffffffff) {
        RVar5 = -1;
      }
      else {
        RVar5 = pRVar1[uVar3].ref;
      }
    } while (iVar6 != -1);
  }
  RVar5 = -1;
  uVar3 = 0xffffffff;
  if (-1 < node0) {
    uVar3 = 0xffffffff;
    if (node0 < ref_cell->ref_adj->nnode) {
      uVar3 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node0];
    }
  }
  if ((int)uVar3 != -1) {
    RVar5 = ref_cell->ref_adj->item[(int)uVar3].ref;
  }
  do {
    if ((int)uVar3 == -1) {
      *allowed = 1;
      return 0;
    }
    if (0 < ref_cell->node_per) {
      iVar6 = 0;
      do {
        if (ref_cell->c2n[ref_cell->size_per * RVar5 + iVar6] == node1) {
          uVar2 = ref_cell_nodes(ref_cell,RVar5,local_a8);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x35b,"ref_split_edge_tri_quality",(ulong)uVar2,"cell nodes");
            return uVar2;
          }
          if (0 < ref_cell->node_per) {
            lVar4 = 0;
            do {
              if (local_a8[lVar4] == node0) {
                local_a8[lVar4] = new_node;
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 < ref_cell->node_per);
          }
          uVar2 = ref_node_tri_quality(ref_node,local_a8,&local_b8);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x35f,"ref_split_edge_tri_quality",(ulong)uVar2,"q0");
            return uVar2;
          }
          uVar2 = ref_node_tri_area(ref_node,local_a8,&local_c8);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x360,"ref_split_edge_tri_quality",(ulong)uVar2,"area0");
            return uVar2;
          }
          if (0 < ref_cell->node_per) {
            lVar4 = 0;
            do {
              if (local_a8[lVar4] == new_node) {
                local_a8[lVar4] = node0;
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 < ref_cell->node_per);
          }
          if (0 < ref_cell->node_per) {
            lVar4 = 0;
            do {
              if (local_a8[lVar4] == node1) {
                local_a8[lVar4] = new_node;
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 < ref_cell->node_per);
          }
          uVar2 = ref_node_tri_quality(ref_node,local_a8,&local_c0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x366,"ref_split_edge_tri_quality",(ulong)uVar2,"q1");
            return uVar2;
          }
          uVar2 = ref_node_tri_area(ref_node,local_a8,&local_d0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x367,"ref_split_edge_tri_quality",(ulong)uVar2,"area1");
            return uVar2;
          }
          dVar7 = ref_grid->adapt->split_quality_absolute;
          if (local_b8 < dVar7) {
            return 0;
          }
          if (local_c0 < dVar7) {
            return 0;
          }
          dVar7 = ref_grid->adapt->split_quality_relative * local_f8;
          if (local_b8 < dVar7) {
            return 0;
          }
          if (local_c0 < dVar7) {
            return 0;
          }
          if (local_c8 < ref_node->min_volume) {
            return 0;
          }
          if (local_d0 < ref_node->min_volume) {
            return 0;
          }
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < ref_cell->node_per);
    }
    pRVar1 = ref_cell->ref_adj->item;
    uVar3 = (ulong)pRVar1[(int)uVar3].next;
    if (uVar3 == 0xffffffffffffffff) {
      RVar5 = -1;
    }
    else {
      RVar5 = pRVar1[uVar3].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_tri_quality(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node,
                                              REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL quality, quality0, quality1;
  REF_DBL min_existing_quality;
  REF_DBL area0, area1;

  *allowed = REF_FALSE;

  min_existing_quality = 1.0;
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");

    RSS(ref_node_tri_quality(ref_node, nodes, &quality), "q");
    min_existing_quality = MIN(min_existing_quality, quality);
  }

  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_node_tri_quality(ref_node, nodes, &quality0), "q0");
    RSS(ref_node_tri_area(ref_node, nodes, &area0), "area0");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_node_tri_quality(ref_node, nodes, &quality1), "q1");
    RSS(ref_node_tri_area(ref_node, nodes, &area1), "area1");

    if (quality0 < ref_grid_adapt(ref_grid, split_quality_absolute) ||
        quality1 < ref_grid_adapt(ref_grid, split_quality_absolute) ||
        quality0 < ref_grid_adapt(ref_grid, split_quality_relative) *
                       min_existing_quality ||
        quality1 < ref_grid_adapt(ref_grid, split_quality_relative) *
                       min_existing_quality ||
        area0 < ref_node_min_volume(ref_node) ||
        area1 < ref_node_min_volume(ref_node))
      return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}